

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_3911c5::read
          (anon_unknown_dwarf_3911c5 *this,int __fd,void *__buf,size_t __nbytes)

{
  long *plVar1;
  long lVar2;
  undefined4 in_register_00000034;
  InputStream *stream;
  Int64 convertedOffset;
  long local_8;
  
  plVar1 = *(long **)(this + 0x18);
  lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1,CONCAT44(in_register_00000034,__fd));
  if (lVar2 == CONCAT44(in_register_00000034,__fd)) {
    if (__nbytes == 0) {
      local_8 = 0;
    }
    else {
      local_8 = (**(code **)(*plVar1 + 0x10))(plVar1,__buf,__nbytes);
    }
  }
  else {
    local_8 = (long)(int)(uint)(__nbytes == 0);
  }
  return local_8;
}

Assistant:

unsigned long read(FT_Stream rec, unsigned long offset, unsigned char* buffer, unsigned long count)
    {
        sf::Int64 convertedOffset = static_cast<sf::Int64>(offset);
        sf::InputStream* stream = static_cast<sf::InputStream*>(rec->descriptor.pointer);
        if (stream->seek(convertedOffset) == convertedOffset)
        {
            if (count > 0)
                return static_cast<unsigned long>(stream->read(reinterpret_cast<char*>(buffer), static_cast<sf::Int64>(count)));
            else
                return 0;
        }
        else
            return count > 0 ? 0 : 1; // error code is 0 if we're reading, or nonzero if we're seeking
    }